

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scgi_api.cpp
# Opt level: O3

void __thiscall
cppcms::impl::cgi::scgi::on_headers_chunk_read(scgi *this,error_code *e,size_t param_2,handler *h)

{
  string_pool *this_00;
  size_t sVar1;
  char *key;
  char *value;
  pointer pcVar2;
  pointer pcVar3;
  char *pcVar4;
  error_code local_40;
  
  if (e->_M_value != 0) {
    booster::callback<void_(const_std::error_code_&)>::operator()(h,e);
    return;
  }
  pcVar2 = (this->buffer_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pcVar2[-1] == ',') {
    pcVar3 = (this->buffer_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start;
    pcVar4 = pcVar3 + this->sep_ + 1;
    if (pcVar4 < pcVar2 + -1) {
      this_00 = &(this->super_connection).pool_;
      do {
        sVar1 = strlen(pcVar4);
        key = string_pool::allocate_space(this_00,sVar1 + 1);
        memcpy(key,pcVar4,sVar1);
        key[sVar1] = '\0';
        sVar1 = strlen(pcVar4);
        pcVar4 = pcVar4 + sVar1 + 1;
        pcVar2 = (this->buffer_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        if (pcVar2 + -1 <= pcVar4) break;
        sVar1 = strlen(pcVar4);
        value = string_pool::allocate_space(this_00,sVar1 + 1);
        memcpy(value,pcVar4,sVar1);
        value[sVar1] = '\0';
        sVar1 = strlen(pcVar4);
        string_map::add(&(this->super_connection).env_,key,value);
        pcVar4 = pcVar4 + sVar1 + 1;
        pcVar2 = (this->buffer_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      } while (pcVar4 < pcVar2 + -1);
      pcVar3 = (this->buffer_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start;
    }
    if (pcVar2 != pcVar3) {
      (this->buffer_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
      super__Vector_impl_data._M_finish = pcVar3;
    }
    local_40._M_value = 0;
    local_40._M_cat = (error_category *)std::_V2::system_category();
  }
  else {
    pcVar2[-1] = '\0';
    local_40._M_value = 1;
    local_40._M_cat = (error_category *)&cppcms_category;
  }
  booster::callback<void_(const_std::error_code_&)>::operator()(h,&local_40);
  return;
}

Assistant:

void on_headers_chunk_read(booster::system::error_code const &e,size_t ,handler const &h)
		{
			if(e) { h(e); return; }
			if(buffer_.back()!=',') {
				buffer_.back() = 0;
				// make sure it is NUL terminated
				h(booster::system::error_code(errc::protocol_violation,cppcms_category));
				return;
			}

			char const *p=&buffer_[sep_ + 1];
			while(p < &buffer_.back()) {
				char *key=pool_.add(p);
				p+=strlen(p)+1;
				if(p>=&buffer_.back())
					break;
				char *value=pool_.add(p);
				p+=strlen(p)+1;
				env_.add(key,value);
			}
			buffer_.clear();

			h(booster::system::error_code());
		}